

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginSection
          (BinaryReaderObjdump *this,Index section_index,BinarySection section_code,Offset size)

{
  ObjdumpMode OVar1;
  ObjdumpState *pOVar2;
  pointer pbVar3;
  ObjdumpOptions *pOVar4;
  char *__s1;
  Offset OVar5;
  size_t offset;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  string match_name;
  string local_58;
  string_view local_38;
  
  BinaryReaderObjdumpBase::BeginSection
            (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  pcVar7 = GetSectionName(section_code);
  pOVar2 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  uVar8 = (ulong)section_index;
  pbVar3 = (pOVar2->section_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.data_ = (pointer)0x0;
  local_38.size_ = 0;
  if (uVar8 < (ulong)((long)(pOVar2->section_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
    local_38.data_ = pbVar3[uVar8]._M_dataplus._M_p;
    local_38.size_ = pbVar3[uVar8]._M_string_length;
  }
  string_view::to_string_abi_cxx11_(&local_58,&local_38);
  pOVar4 = (this->super_BinaryReaderObjdumpBase).options_;
  __s1 = pOVar4->section_name;
  if (__s1 == (char *)0x0) {
    bVar9 = true;
  }
  else {
    iVar6 = strcasecmp(__s1,local_58._M_dataplus._M_p);
    bVar9 = iVar6 == 0;
  }
  if (bVar9) {
    (this->super_BinaryReaderObjdumpBase).section_found_ = true;
  }
  OVar1 = pOVar4->mode;
  if (OVar1 == RawData) {
    if (bVar9) {
      printf("\nContents of section %s:\n",pcVar7);
      offset = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                super_BinaryReaderDelegate.state)->offset;
      Stream::WriteMemoryDump
                (&((this->out_stream_)._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                 (this->super_BinaryReaderObjdumpBase).data_ + offset,size,offset,Yes,(char *)0x0,
                 (char *)0x0);
    }
  }
  else if (OVar1 == Details) {
    if (bVar9) {
      printf("%s",pcVar7);
      if (((uint)section_code < 0xd) && ((0x1101U >> (section_code & 0x1f) & 1) != 0)) {
        puts(":");
      }
      (this->super_BinaryReaderObjdumpBase).print_details_ = true;
    }
    else {
      (this->super_BinaryReaderObjdumpBase).print_details_ = false;
    }
  }
  else if (OVar1 == Headers) {
    OVar5 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset;
    printf("%9s start=%#010zx end=%#010zx (size=%#010zx) ",pcVar7,OVar5,OVar5 + size,size);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginSection(Index section_index,
                                         BinarySection section_code,
                                         Offset size) {
  BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);

  // |section_name| and |match_name| are identical for known sections. For
  // custom sections, |section_name| is "Custom", but |match_name| is the name
  // of the custom section.
  const char* section_name = wabt::GetSectionName(section_code);
  std::string match_name = GetSectionName(section_index).to_string();

  bool section_match = !options_->section_name ||
                       !strcasecmp(options_->section_name, match_name.c_str());
  if (section_match) {
    section_found_ = true;
  }

  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("%9s start=%#010" PRIzx " end=%#010" PRIzx " (size=%#010" PRIoffset
             ") ",
             section_name, state->offset, state->offset + size, size);
      break;
    case ObjdumpMode::Details:
      if (section_match) {
        printf("%s", section_name);
        // All known section types except the Start and DataCount sections have
        // a count in which case this line gets completed in OnCount().
        if (section_code == BinarySection::Start ||
            section_code == BinarySection::DataCount ||
            section_code == BinarySection::Custom) {
          printf(":\n");
        }
        print_details_ = true;
      } else {
        print_details_ = false;
      }
      break;
    case ObjdumpMode::RawData:
      if (section_match) {
        printf("\nContents of section %s:\n", section_name);
        out_stream_->WriteMemoryDump(data_ + state->offset, size, state->offset,
                                     PrintChars::Yes);
      }
      break;
    case ObjdumpMode::Prepass:
    case ObjdumpMode::Disassemble:
      break;
  }
  return Result::Ok;
}